

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.hpp
# Opt level: O3

double * __thiscall eos::core::Image<double>::operator()(Image<double> *this,int y,int x)

{
  double *pdVar1;
  
  if ((this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __assert_fail("data_.size() > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/core/Image.hpp"
                  ,0x47,
                  "PixelType &eos::core::Image<double>::operator()(int, int) [PixelType = double]");
  }
  if ((-1 < y) && (y < this->height_)) {
    if ((-1 < x) && (x < this->width_)) {
      pdVar1 = (double *)byte_ptr(this,y,x);
      return pdVar1;
    }
    __assert_fail("x >= 0 && x < width_",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/core/Image.hpp"
                  ,0x4a,
                  "PixelType &eos::core::Image<double>::operator()(int, int) [PixelType = double]");
  }
  __assert_fail("y >= 0 && y < height_",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/core/Image.hpp"
                ,0x49,
                "PixelType &eos::core::Image<double>::operator()(int, int) [PixelType = double]");
}

Assistant:

PixelType& operator()(int y, int x) noexcept
    {
        assert(data_.size() > 0); // byte_ptr() checks this but let's put the assert here too, because this
                                  // function is public-facing.
        assert(y >= 0 && y < height_);
        assert(x >= 0 && x < width_);
        return *data(y, x);
    }